

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::
best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
::best_solution_recorder
          (best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
           *this,random_engine *rng,uint thread_number,quadratic_cost_type<double> *costs,
          double cost_constant,int variables,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *constraints,int population_size)

{
  ulong __n;
  rep rVar1;
  allocator<double> local_49;
  value_type_conflict2 local_48;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *local_40;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *constraints_local;
  double dStack_30;
  int variables_local;
  double cost_constant_local;
  quadratic_cost_type<double> *costs_local;
  random_engine *prStack_18;
  uint thread_number_local;
  random_engine *rng_local;
  best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
  *this_local;
  
  local_40 = constraints;
  constraints_local._4_4_ = variables;
  dStack_30 = cost_constant;
  cost_constant_local = (double)costs;
  costs_local._4_4_ = thread_number;
  prStack_18 = rng;
  rng_local = (random_engine *)this;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_start);
  storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>::storage
            (&this->m_storage,prStack_18,(quadratic_cost_type<double> *)cost_constant_local,
             dStack_30,population_size,constraints_local._4_4_,local_40);
  __n = (ulong)costs_local._4_4_;
  local_48 = 0.0;
  std::allocator<double>::allocator(&local_49);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->m_kappa_append,__n,&local_48,&local_49);
  std::allocator<double>::~allocator(&local_49);
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->m_start).__d.__r = rVar1;
  return;
}

Assistant:

best_solution_recorder(random_engine& rng,
                           const unsigned thread_number,
                           const Cost& costs,
                           const double cost_constant,
                           const int variables,
                           const std::vector<merged_constraint>& constraints,
                           const int population_size)
      : m_storage{ rng,       costs,      cost_constant, population_size,
                   variables, constraints }
      , m_kappa_append(std::size_t{ thread_number }, 0.0)
    {
        m_start = std::chrono::steady_clock::now();
    }